

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<unsigned_char,_128UL>::small_vector
          (small_vector<unsigned_char,_128UL> *this,small_vector<unsigned_char,_128UL> *rhs)

{
  size_t new_cap;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> __result;
  small_vector<unsigned_char,_128UL> *rhs_local;
  small_vector<unsigned_char,_128UL> *this_local;
  
  small_vector(this);
  new_cap = size(rhs);
  reserve(this,new_cap);
  __first = std::begin<pstore::small_vector<unsigned_char,128ul>>(rhs);
  __last = std::end<pstore::small_vector<unsigned_char,128ul>>(rhs);
  __result = std::back_inserter<pstore::small_vector<unsigned_char,128ul>>(this);
  std::
  copy<pstore::pointer_based_iterator<unsigned_char_const>,std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>
            ((pointer_based_iterator<const_unsigned_char>)__first.pos_,
             (pointer_based_iterator<const_unsigned_char>)__last.pos_,__result);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (small_vector const & rhs)
            : small_vector () {
        this->reserve (rhs.size ());
        std::copy (std::begin (rhs), std::end (rhs), std::back_inserter (*this));
    }